

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
preciseUnitOps_HashCoversFullUnitDataWidth_Test::TestBody
          (preciseUnitOps_HashCoversFullUnitDataWidth_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  hash<units::precise_unit> local_29;
  size_t local_28;
  size_t h2;
  size_t local_18;
  size_t h1;
  preciseUnitOps_HashCoversFullUnitDataWidth_Test *this_local;
  
  h1 = (size_t)this;
  local_18 = std::hash<units::precise_unit>::operator()
                       ((hash<units::precise_unit> *)((long)&h2 + 7),
                        (precise_unit *)units::precise::m);
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator*
                 ((precise_unit *)units::precise::m,(precise_unit *)units::precise::count);
  local_28 = std::hash<units::precise_unit>::operator()
                       (&local_29,(precise_unit *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_50,"h1","h2",&local_18,&local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1be,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  return;
}

Assistant:

TEST(preciseUnitOps, HashCoversFullUnitDataWidth)
{
    auto h1 = std::hash<precise_unit>()(precise::m);
    auto h2 = std::hash<precise_unit>()(precise::m * precise::count);
    EXPECT_NE(h1, h2);
}